

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_node.hpp
# Opt level: O0

void __thiscall
ranger::bhvr_tree::
sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec_impl(sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
            *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                  *ap,
           abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *node,handler_type *hdl)

{
  anon_class_56_4_3ec9ec79 local_80;
  function<void_(bool,_test_agent_*)> local_48;
  handler_type *local_28;
  handler_type *hdl_local;
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *node_local;
  agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
  *ap_local;
  sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *this_local;
  
  local_28 = hdl;
  hdl_local = (handler_type *)node;
  node_local = (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                *)ap;
  ap_local = (agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
              *)this;
  if (node == (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
               *)0x0) {
    agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
    ::operator()(ap,hdl,true);
  }
  else {
    local_80.ap = ap;
    std::function<void_(bool,_test_agent_*)>::function(&local_80.hdl,hdl);
    local_80.node =
         (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
          *)hdl_local;
    local_80.this = this;
    std::function<void(bool,test_agent*)>::
    function<ranger::bhvr_tree::sequence_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec_impl(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>*,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
              ((function<void(bool,test_agent*)> *)&local_48,&local_80);
    (*node->_vptr_abstract_node[2])(node,ap,&local_48);
    std::function<void_(bool,_test_agent_*)>::~function(&local_48);
    const::{lambda(bool,test_agent*)#1}::~abstract_node((_lambda_bool_test_agent___1_ *)&local_80);
  }
  return;
}

Assistant:

void exec_impl(AgentProxy& ap,
                 abstract_node<AgentProxy>* node,
                 typename AgentProxy::handler_type hdl) const {
    if (node) {
      node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
        if (!result) {
          ap(hdl, false);
        } else {
          exec_impl(ap, node->get_next_sibling(), std::move(hdl));
        }
      });
    } else {
      ap(hdl, true);
    }
  }